

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChExtruderBeamIGA::ChExtruderBeamIGA
          (ChExtruderBeamIGA *this,ChSystem *msystem,shared_ptr<chrono::fea::ChMesh> *mmesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,double mh,ChCoordsys<double> *moutlet
          ,double mspeed,int morder)

{
  shared_ptr<chrono::ChBody> *this_00;
  shared_ptr<chrono::ChLinkMotorLinearSpeed> *this_01;
  ChSystem *pCVar1;
  ChMesh *this_02;
  element_type *peVar2;
  ChLinkMotorLinearSpeed *this_03;
  element_type *peVar3;
  ChLog *this_04;
  ChStreamOutAscii *pCVar4;
  int i;
  int iVar5;
  ChCoordsys<double> *this_05;
  undefined1 auVar6 [32];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_2d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_2c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_2b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_2a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a0;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_298 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  shared_ptr<chrono::ChFunction> local_288;
  ChFrame<double> local_278;
  ChVector<double> local_1e8;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  (this->outlet).pos.m_data[2] = 0.0;
  this_05 = &this->outlet;
  (this->outlet).pos.m_data[0] = 0.0;
  (this->outlet).pos.m_data[1] = 0.0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6 = ZEXT432(0) << 0x40;
  this->ground = (shared_ptr<chrono::ChBody>)auVar6._0_16_;
  this->actuator = (shared_ptr<chrono::ChLinkMotorLinearSpeed>)auVar6._16_16_;
  this->actuator = (shared_ptr<chrono::ChLinkMotorLinearSpeed>)auVar6._0_16_;
  this->guide = (shared_ptr<chrono::ChLinkMateGeneric>)auVar6._16_16_;
  auVar6 = ZEXT432(0) << 0x40;
  this->mesh = (shared_ptr<chrono::fea::ChMesh>)auVar6._0_16_;
  this->beam_section = (shared_ptr<chrono::fea::ChBeamSectionCosserat>)auVar6._16_16_;
  (this->outlet).rot.m_data[0] = 1.0;
  (this->outlet).rot.m_data[3] = 0.0;
  (this->outlet).rot.m_data[1] = 0.0;
  (this->outlet).rot.m_data[2] = 0.0;
  this->contact_material = (shared_ptr<chrono::ChMaterialSurfaceSMC>)auVar6._0_16_;
  this->contactcloud = (shared_ptr<chrono::fea::ChContactSurfaceNodeCloud>)auVar6._16_16_;
  this->beam_order = morder;
  this->h = mh;
  ChCoordsys<double>::operator=(this_05,moutlet);
  this->mysystem = msystem;
  std::__shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>,
             &mmesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->beam_section).
              super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>,
             &sect->
              super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>);
  this->mytime = 0.0;
  this->speed = mspeed;
  chrono_types::make_shared<chrono::ChBody,_0>();
  this_00 = &this->ground;
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278.coord);
  ChBody::SetBodyFixed
            ((this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,true);
  pCVar1 = this->mysystem;
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_298,&this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChSystem::Add(pCVar1,(shared_ptr<chrono::ChPhysicsItem> *)local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
  ChFrame<double>::ChFrame(&local_278,this_05);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
            ((chrono_types *)&nodeA,&local_278);
  peVar3 = nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1e8.m_data[2] = this->speed;
  local_1e8.m_data[0] = local_1e8.m_data[2] * VECT_X;
  local_1e8.m_data[1] = local_1e8.m_data[2] * DAT_011dd3f8;
  local_1e8.m_data[2] = local_1e8.m_data[2] * DAT_011dd400;
  ChQuaternion<double>::Rotate(&(this->outlet).rot,&local_1e8);
  (**(code **)(*(long *)&(peVar3->super_ChNodeFEAbase).field_0x18 + 0x38))
            (&(peVar3->super_ChNodeFEAbase).field_0x18,&local_278);
  peVar3 = nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_278._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_1e8.m_data[2] = 0.0;
  local_278.coord.pos.m_data[2] = 0.0;
  local_1e8.m_data[0] = 0.0;
  local_1e8.m_data[1] = 0.0;
  local_278.coord.pos.m_data[0] = 0.0;
  local_278.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame(&local_b8,&local_1e8,(ChQuaternion<double> *)&local_278);
  ChFrame<double>::operator=(&peVar3->X0,&local_b8);
  this_02 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
            (local_2a8,
             &nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  ChMesh::AddNode(this_02,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a0);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(&this->beam_nodes,&nodeA);
  this_01 = &this->actuator;
  for (iVar5 = 0; iVar5 <= this->beam_order; iVar5 = iVar5 + 1) {
    local_278._vptr_ChFrame = (_func_int **)0x4059400000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->beam_knots,(double *)&local_278);
  }
  local_278._vptr_ChFrame = (_func_int **)0x4059000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->beam_knots,(double *)&local_278);
  this_04 = GetLog();
  pCVar4 = ChStreamOutAscii::operator<<(&this_04->super_ChStreamOutAscii,"Create node n.");
  pCVar4 = ChStreamOutAscii::operator<<
                     (pCVar4,(long)(this->beam_nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->beam_nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pCVar4 = ChStreamOutAscii::operator<<(pCVar4," at x=");
  pCVar4 = ChStreamOutAscii::operator<<
                     (pCVar4,*(double *)
                              &((nodeA.
                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_ChNodeFEAbase).field_0x20);
  pCVar4 = ChStreamOutAscii::operator<<(pCVar4," x0=");
  pCVar4 = ChStreamOutAscii::operator<<
                     (pCVar4,((nodeA.
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->X0).coord.pos.m_data[0]);
  ChStreamOutAscii::operator<<(pCVar4,"\n");
  std::make_shared<chrono::ChLinkMotorLinearSpeed>();
  std::__shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->
              super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2> *)&local_278)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278.coord);
  pCVar1 = this->mysystem;
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLinkMotorLinearSpeed,void>
            (local_2b8,
             &this_01->
              super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>);
  ChSystem::Add(pCVar1,(shared_ptr<chrono::ChPhysicsItem> *)local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0);
  peVar2 = (this_01->super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
            (local_2c8,
             &nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_2d8,&this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChFrame<double>::ChFrame(&local_140,this_05);
  ChFrame<double>::ChFrame(&local_1c8,this_05);
  (**(code **)(*(long *)&(peVar2->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric
                         .super_ChLinkMate.super_ChLink + 0x248))
            (peVar2,local_2c8,local_2d8,0,&local_140,&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0);
  this_03 = (this_01->super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  std::make_shared<chrono::ChFunction_Const,double&>((double *)&local_278);
  local_288.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278._vptr_ChFrame;
  local_288.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.coord.pos.m_data[0];
  local_278._vptr_ChFrame = (_func_int **)0x0;
  local_278.coord.pos.m_data[0] = 0.0;
  ChLinkMotorLinearSpeed::SetSpeedFunction(this_03,&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278.coord);
  *(double *)
   &(((this->actuator).
      super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChLinkMotorLinear).field_0x278 = this->h;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

ChExtruderBeamIGA::ChExtruderBeamIGA(ChSystem* msystem,              // system to store the constraints
                                     std::shared_ptr<ChMesh> mmesh,  // mesh to store the resulting elements
                                     std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                     double mh,                                    // element length
                                     const ChCoordsys<> moutlet,  // outlet pos & orientation (x is extrusion direction)
                                     double mspeed,               // speed
                                     int morder                   // element order
) {
    beam_order = morder;
    h = mh;
    outlet = moutlet;
    mysystem = msystem;
    mesh = mmesh;
    beam_section = sect;
    mytime = 0;
    speed = mspeed;

    ground = chrono_types::make_shared<ChBody>();
    ground->SetBodyFixed(true);
    mysystem->Add(ground);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(outlet));
    nodeA->SetPos_dt(outlet.TransformDirectionLocalToParent(VECT_X * this->speed));
    nodeA->SetX0(ChFrame<>());
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    // p+1 repeated end knots for the start
    for (int i = 0; i < this->beam_order + 1; ++i) {
        beam_knots.push_back(101.);
    }
    beam_knots.push_back(100.);

    GetLog() << "Create node n." << beam_nodes.size() << " at x=" << nodeA->GetPos().x()
             << " x0=" << nodeA->GetX0().GetPos().x() << "\n";

    actuator = chrono_types::make_shared<ChLinkMotorLinearSpeed>();
    mysystem->Add(actuator);
    actuator->Initialize(nodeA, ground, false, ChFrame<>(outlet), ChFrame<>(outlet));
    actuator->SetSpeedFunction(chrono_types::make_shared<ChFunction_Const>(this->speed));
    actuator->SetMotionOffset(this->h);
}